

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::Optimizer::BindScalarFunction
          (Optimizer *this,string *name,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children)

{
  InternalException *this_00;
  undefined8 *in_RCX;
  allocator local_129;
  string local_128;
  undefined1 local_108 [24];
  FunctionBinder binder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ErrorData error;
  
  FunctionBinder::FunctionBinder(&binder,(ClientContext *)(name->_M_dataplus)._M_p);
  ErrorData::ErrorData(&error);
  ::std::__cxx11::string::string((string *)&local_128,"main",&local_129);
  local_108._0_8_ = *in_RCX;
  local_108._8_8_ = in_RCX[1];
  local_108._16_8_ = in_RCX[2];
  *in_RCX = 0;
  in_RCX[1] = 0;
  in_RCX[2] = 0;
  FunctionBinder::BindScalarFunction
            ((FunctionBinder *)this,(string *)&binder,&local_128,children,(ErrorData *)local_108,
             SUB81(&error,0),(optional_ptr<duckdb::Binder,_true>)0x0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)local_108);
  ::std::__cxx11::string::~string((string *)&local_128);
  if (error.initialized != true) {
    ErrorData::~ErrorData(&error);
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_128,"Optimizer exception - failed to bind function %s: %s",&local_129)
  ;
  ::std::__cxx11::string::string((string *)&local_c0,(string *)children);
  ::std::__cxx11::string::string((string *)&local_e0,(string *)&error.final_message);
  InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_128,&local_c0,&local_e0);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<Expression> Optimizer::BindScalarFunction(const string &name, vector<unique_ptr<Expression>> children) {
	FunctionBinder binder(context);
	ErrorData error;
	auto expr = binder.BindScalarFunction(DEFAULT_SCHEMA, name, std::move(children), error);
	if (error.HasError()) {
		throw InternalException("Optimizer exception - failed to bind function %s: %s", name, error.Message());
	}
	return expr;
}